

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O2

void tcu::writeXmlCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  TestNodeType TVar1;
  char *__s;
  State SVar2;
  deBool dVar3;
  char *__s_00;
  TestNode *pTVar4;
  FILE *__stream;
  qpXmlWriter *writer;
  Exception *pEVar5;
  uint uVar6;
  allocator<char> local_18a;
  allocator<char> local_189;
  string caseName;
  qpXmlAttribute attribs [2];
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  string description;
  string filename;
  string local_98;
  TestHierarchyIterator iter;
  
  DefaultHierarchyInflater::DefaultHierarchyInflater(&inflater,testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)attribs,
             testCtx->m_cmdLine,testCtx->m_curArchive);
  caseListFilter.
  super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>.m_data
  .ptr = (CaseListFilter *)attribs[0].name;
  attribs[0].name = (char *)0x0;
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
  ~UniqueBase((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)attribs);
  TestHierarchyIterator::TestHierarchyIterator
            (&iter,root,&inflater.super_TestHierarchyInflater,
             caseListFilter.
             super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
             .m_data.ptr);
  __s_00 = CommandLine::getCaseListExportFile(cmdLine);
  while( true ) {
    SVar2 = TestHierarchyIterator::getState(&iter);
    if (SVar2 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator(&iter);
      de::details::
      UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
      ~UniqueBase(&caseListFilter.
                   super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                 );
      DefaultHierarchyInflater::~DefaultHierarchyInflater(&inflater);
      return;
    }
    pTVar4 = TestHierarchyIterator::getNode(&iter);
    __s = (pTVar4->m_name)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)attribs,__s_00,(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&caseName,__s,&local_18a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&description,"xml",&local_189);
    makePackageFilename(&filename,(string *)attribs,&caseName,&description);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)attribs);
    __stream = fopen(filename._M_dataplus._M_p,"wb");
    if (__stream == (FILE *)0x0) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attribs,
                     "Failed to open ",&filename);
      Exception::Exception(pEVar5,(string *)attribs);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    writer = qpXmlWriter_createFileWriter((FILE *)__stream,0,0);
    if (writer == (qpXmlWriter *)0x0) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)attribs,"XML writer creation failed",(allocator<char> *)&caseName);
      Exception::Exception(pEVar5,(string *)attribs);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    print("Writing test cases from \'%s\' to file \'%s\'..\n",__s,filename._M_dataplus._M_p);
    pTVar4 = TestHierarchyIterator::getNode(&iter);
    attribs[0].stringValue = (pTVar4->m_name)._M_dataplus._M_p;
    attribs[0].name = "PackageName";
    attribs[0].type = QP_XML_ATTRIBUTE_STRING;
    attribs[0].intValue = -0x2a6;
    attribs[0].boolValue = -1;
    attribs[1].stringValue = (pTVar4->m_description)._M_dataplus._M_p;
    attribs[1].name = "Description";
    attribs[1].type = QP_XML_ATTRIBUTE_STRING;
    attribs[1].intValue = -0x2a6;
    attribs[1].boolValue = -1;
    dVar3 = qpXmlWriter_startDocument(writer);
    if (dVar3 == 0) break;
    dVar3 = qpXmlWriter_startElement(writer,"TestCaseList",2,attribs);
    if (dVar3 == 0) break;
    TestHierarchyIterator::next(&iter);
    while( true ) {
      pTVar4 = TestHierarchyIterator::getNode(&iter);
      if (pTVar4->m_nodeType == NODETYPE_PACKAGE) break;
      pTVar4 = TestHierarchyIterator::getNode(&iter);
      TVar1 = pTVar4->m_nodeType;
      SVar2 = TestHierarchyIterator::getState(&iter);
      if (SVar2 == STATE_ENTER_NODE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&caseName,(pTVar4->m_name)._M_dataplus._M_p,(allocator<char> *)attribs)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&description,(pTVar4->m_description)._M_dataplus._M_p,
                   (allocator<char> *)attribs);
        attribs[0].name = "Name";
        attribs[0].type = QP_XML_ATTRIBUTE_STRING;
        attribs[0].stringValue = caseName._M_dataplus._M_p;
        attribs[0].intValue = -0x2a6;
        attribs[0].boolValue = -1;
        uVar6 = TVar1 - NODETYPE_GROUP;
        if (uVar6 < 5) {
          attribs[1].stringValue = &DAT_00608e10 + *(int *)(&DAT_00608e10 + (ulong)uVar6 * 4);
        }
        else {
          attribs[1].stringValue = (char *)0x0;
        }
        attribs[1].name = "CaseType";
        attribs[1].type = QP_XML_ATTRIBUTE_STRING;
        attribs[1].intValue = -0x2a6;
        attribs[1].boolValue = -1;
        dVar3 = qpXmlWriter_startElement(writer,"TestCase",3,attribs);
        if (dVar3 == 0) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"Writing to case list file failed",&local_18a);
          Exception::Exception(pEVar5,&local_98);
          __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
        }
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&caseName);
      }
      else {
        dVar3 = qpXmlWriter_endElement(writer,"TestCase");
        if (dVar3 == 0) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)attribs,"Writing to case list file failed",
                     (allocator<char> *)&caseName);
          Exception::Exception(pEVar5,(string *)attribs);
          __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
        }
      }
      TestHierarchyIterator::next(&iter);
    }
    dVar3 = qpXmlWriter_endElement(writer,"TestCaseList");
    if (dVar3 == 0) {
LAB_0057d0af:
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)attribs,"Failed to terminate XML document",(allocator<char> *)&caseName);
      Exception::Exception(pEVar5,(string *)attribs);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    dVar3 = qpXmlWriter_endDocument(writer);
    if (dVar3 == 0) goto LAB_0057d0af;
    qpXmlWriter_destroy(writer);
    fclose(__stream);
    TestHierarchyIterator::next(&iter);
    std::__cxx11::string::~string((string *)&filename);
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&caseName,"Failed to start XML document",(allocator<char> *)&description);
  Exception::Exception(pEVar5,&caseName);
  __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeXmlCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "xml");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		FILE*			file	= DE_NULL;
		qpXmlWriter*	writer	= DE_NULL;

		try
		{
			file = fopen(filename.c_str(), "wb");
			if (!file)
				throw Exception("Failed to open " + filename);

			writer = qpXmlWriter_createFileWriter(file, DE_FALSE, DE_FALSE);
			if (!writer)
				throw Exception("XML writer creation failed");

			print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

			writeXmlCaselist(iter, writer);

			qpXmlWriter_destroy(writer);
			writer = DE_NULL;

			fclose(file);
			file = DE_NULL;
		}
		catch (...)
		{
			if (writer)
				qpXmlWriter_destroy(writer);
			if (file)
				fclose(file);
			throw;
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}